

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

_Bool golf_level_get_camera_zone
                (golf_level_t *level,vec3 pos,golf_camera_zone_entity_t *camera_zone)

{
  int iVar1;
  golf_entity_t *pgVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  iVar1 = (level->entities).length;
  bVar9 = 0 < iVar1;
  if (0 < iVar1) {
    lVar11 = 0x78;
    lVar12 = 0;
    do {
      pgVar2 = (level->entities).data;
      bVar8 = false;
      if (*(int *)(pgVar2->name + lVar11 + -0x7c) == 7) {
        bVar8 = false;
        if ((pos.x < *(float *)(pgVar2->name + lVar11 + -0x30) +
                     *(float *)(pgVar2->name + lVar11 + -0x14)) &&
           (*(float *)(pgVar2->name + lVar11 + -0x30) - *(float *)(pgVar2->name + lVar11 + -0x14) <
            pos.x)) {
          if ((pos.z < *(float *)(pgVar2->name + lVar11 + -0x28) +
                       *(float *)(pgVar2->name + lVar11 + -0xc)) &&
             (*(float *)(pgVar2->name + lVar11 + -0x28) - *(float *)(pgVar2->name + lVar11 + -0xc) <
              pos.z)) {
            uVar3 = *(undefined8 *)(pgVar2->name + lVar11 + -0x34);
            uVar4 = *(undefined8 *)(pgVar2->name + lVar11 + -0x34 + 8);
            uVar5 = *(undefined8 *)(pgVar2->name + lVar11 + -0x24);
            uVar6 = *(undefined8 *)(pgVar2->name + lVar11 + -0x24 + 8);
            uVar7 = *(undefined8 *)(pgVar2->name + lVar11 + -0x18 + 8);
            *(undefined8 *)&(camera_zone->transform).rotation.w =
                 *(undefined8 *)(pgVar2->name + lVar11 + -0x18);
            (camera_zone->transform).scale.y = (float)(int)uVar7;
            (camera_zone->transform).scale.z = (float)(int)((ulong)uVar7 >> 0x20);
            (camera_zone->transform).rotation.x = (float)(int)uVar5;
            (camera_zone->transform).rotation.y = (float)(int)((ulong)uVar5 >> 0x20);
            (camera_zone->transform).rotation.z = (float)(int)uVar6;
            (camera_zone->transform).rotation.w = (float)(int)((ulong)uVar6 >> 0x20);
            camera_zone->towards_hole = (_Bool)(char)uVar3;
            *(int3 *)&camera_zone->field_0x1 = (int3)((ulong)uVar3 >> 8);
            (camera_zone->transform).position.x = (float)(int)((ulong)uVar3 >> 0x20);
            (camera_zone->transform).position.y = (float)(int)uVar4;
            (camera_zone->transform).position.z = (float)(int)((ulong)uVar4 >> 0x20);
            bVar8 = true;
          }
        }
      }
      if (bVar8) {
        return bVar9;
      }
      lVar12 = lVar12 + 1;
      lVar10 = (long)(level->entities).length;
      lVar11 = lVar11 + 0x510;
      bVar9 = lVar12 < lVar10;
    } while (lVar12 < lVar10);
  }
  return bVar9;
}

Assistant:

bool golf_level_get_camera_zone(golf_level_t *level, vec3 pos, golf_camera_zone_entity_t *camera_zone) {
    for (int i = 0; i < level->entities.length; i++) {
        golf_entity_t *entity = &level->entities.data[i];
        if (entity->type != CAMERA_ZONE_ENTITY) {
            continue;
        }

        vec3 cz_pos = entity->camera_zone.transform.position;
        vec3 cz_scale = entity->camera_zone.transform.scale;
        if (pos.x < cz_pos.x + cz_scale.x && pos.x > cz_pos.x - cz_scale.x &&
                pos.z < cz_pos.z + cz_scale.z && pos.z > cz_pos.z - cz_scale.z) {
            *camera_zone = entity->camera_zone;
            return true;
        }
    }
    return false;
}